

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string * __thiscall crnlib::dynamic_string::trim_crlf(dynamic_string *this)

{
  ulong uVar1;
  dynamic_string *pdVar2;
  uint len;
  
  uVar1 = (ulong)this->m_len;
  len = (uint)(uVar1 != 0);
  do {
    if ((long)uVar1 < 2) {
LAB_001141d8:
      pdVar2 = crop(this,0,len);
      return pdVar2;
    }
    if ((this->m_pStr[uVar1 - 1] != '\r') && (this->m_pStr[uVar1 - 1] != '\n')) {
      len = (uint)uVar1;
      goto LAB_001141d8;
    }
    uVar1 = uVar1 - 1;
  } while( true );
}

Assistant:

dynamic_string& dynamic_string::trim_crlf()
    {
        int s = 0, e;

        for (e = m_len - 1; e > s; e--)
        {
            if ((m_pStr[e] != 13) && (m_pStr[e] != 10))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }